

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::MessageGenerator
          (MessageGenerator *this,string *root_classname,Descriptor *descriptor,Options *options)

{
  pointer *pppEVar1;
  pointer *pppOVar2;
  pointer *pppEVar3;
  pointer *pppMVar4;
  pointer pcVar5;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  MessageGenerator *pMVar6;
  Descriptor *descriptor_00;
  long lVar7;
  long lVar8;
  Descriptor *pDVar9;
  OneofGenerator *generator;
  MessageGenerator *local_68;
  vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
  *local_60;
  vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
  *local_58;
  vector<google::protobuf::compiler::objectivec::OneofGenerator*,std::allocator<google::protobuf::compiler::objectivec::OneofGenerator*>>
  *local_50;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
  *local_48;
  FieldGeneratorMap *local_40;
  Options *local_38;
  
  (this->root_classname_)._M_dataplus._M_p = (pointer)&(this->root_classname_).field_2;
  pcVar5 = (root_classname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar5,pcVar5 + root_classname->_M_string_length);
  this->descriptor_ = descriptor;
  local_40 = &this->field_generators_;
  local_38 = options;
  FieldGeneratorMap::FieldGeneratorMap(local_40,descriptor,options);
  ClassName_abi_cxx11_(&this->class_name_,(objectivec *)this->descriptor_,descriptor_00);
  GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
            (&this->deprecated_attribute_,descriptor,*(FileDescriptor **)(descriptor + 0x10),false,
             true);
  local_48 = (vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
              *)&this->extension_generators_;
  local_58 = (vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
              *)&this->enum_generators_;
  local_60 = (vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
              *)&this->nested_message_generators_;
  local_50 = (vector<google::protobuf::compiler::objectivec::OneofGenerator*,std::allocator<google::protobuf::compiler::objectivec::OneofGenerator*>>
              *)&this->oneof_generators_;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nested_message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x78)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pMVar6 = (MessageGenerator *)operator_new(0x48);
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)pMVar6,&this->class_name_,
                 (FieldDescriptor *)(*(long *)(pDVar9 + 0x80) + lVar7));
      __position._M_current =
           (this->extension_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = pMVar6;
      if (__position._M_current ==
          (this->extension_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::ExtensionGenerator*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::ExtensionGenerator*>
                  (local_48,__position,(ExtensionGenerator **)&local_68);
      }
      else {
        *__position._M_current = (ExtensionGenerator *)pMVar6;
        pppEVar1 = &(this->extension_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar8 = lVar8 + 1;
      pDVar9 = this->descriptor_;
      lVar7 = lVar7 + 0xa8;
    } while (lVar8 < *(int *)(pDVar9 + 0x78));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pMVar6 = (MessageGenerator *)operator_new(0x38);
      OneofGenerator::OneofGenerator
                ((OneofGenerator *)pMVar6,(OneofDescriptor *)(*(long *)(pDVar9 + 0x40) + lVar8));
      __position_00._M_current =
           (this->oneof_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = pMVar6;
      if (__position_00._M_current ==
          (this->oneof_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::OneofGenerator*,std::allocator<google::protobuf::compiler::objectivec::OneofGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::OneofGenerator*const&>
                  (local_50,__position_00,(OneofGenerator **)&local_68);
      }
      else {
        *__position_00._M_current = (OneofGenerator *)pMVar6;
        pppOVar2 = &(this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      lVar7 = lVar7 + 1;
      pDVar9 = this->descriptor_;
      lVar8 = lVar8 + 0x30;
    } while (lVar7 < *(int *)(pDVar9 + 0x38));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x58)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pMVar6 = (MessageGenerator *)operator_new(0x58);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)pMVar6,(EnumDescriptor *)(*(long *)(pDVar9 + 0x60) + lVar8));
      __position_01._M_current =
           (this->enum_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = pMVar6;
      if (__position_01._M_current ==
          (this->enum_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::EnumGenerator*,std::allocator<google::protobuf::compiler::objectivec::EnumGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::EnumGenerator*const&>
                  (local_58,__position_01,(EnumGenerator **)&local_68);
      }
      else {
        *__position_01._M_current = (EnumGenerator *)pMVar6;
        pppEVar3 = &(this->enum_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar3 = *pppEVar3 + 1;
      }
      lVar7 = lVar7 + 1;
      pDVar9 = this->descriptor_;
      lVar8 = lVar8 + 0x38;
    } while (lVar7 < *(int *)(pDVar9 + 0x58));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x48)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      pMVar6 = (MessageGenerator *)operator_new(0xe0);
      MessageGenerator(pMVar6,&this->root_classname_,
                       (Descriptor *)(*(long *)(pDVar9 + 0x50) + lVar8),local_38);
      __position_02._M_current =
           (this->nested_message_generators_).
           super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68 = pMVar6;
      if (__position_02._M_current ==
          (this->nested_message_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::objectivec::MessageGenerator*,std::allocator<google::protobuf::compiler::objectivec::MessageGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::objectivec::MessageGenerator*const&>
                  (local_60,__position_02,&local_68);
      }
      else {
        *__position_02._M_current = pMVar6;
        pppMVar4 = &(this->nested_message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar4 = *pppMVar4 + 1;
      }
      lVar7 = lVar7 + 1;
      pDVar9 = this->descriptor_;
      lVar8 = lVar8 + 0xa8;
    } while (lVar7 < *(int *)(pDVar9 + 0x48));
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const string& root_classname,
                                   const Descriptor* descriptor,
                                   const Options& options)
    : root_classname_(root_classname),
      descriptor_(descriptor),
      field_generators_(descriptor, options),
      class_name_(ClassName(descriptor_)),
      deprecated_attribute_(
          GetOptionalDeprecatedAttribute(descriptor, descriptor->file(), false, true)) {

  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_.push_back(
        new ExtensionGenerator(class_name_, descriptor_->extension(i)));
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    OneofGenerator* generator = new OneofGenerator(descriptor_->oneof_decl(i));
    oneof_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator* generator = new EnumGenerator(descriptor_->enum_type(i));
    enum_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator* generator =
        new MessageGenerator(root_classname_,
                             descriptor_->nested_type(i),
                             options);
    nested_message_generators_.push_back(generator);
  }
}